

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::debugging_internal::MaybeAppend(State *state,char *str)

{
  bool in_AL;
  bool extraout_AL;
  long lVar1;
  
  if (-1 < *(int *)&(state->parse_state).field_0xc) {
    return in_AL;
  }
  for (lVar1 = 0; str[lVar1] != '\0'; lVar1 = lVar1 + 1) {
  }
  MaybeAppendWithLength(state,str,(int)lVar1);
  return extraout_AL;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    int length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}